

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

String testing::internal::UnitTestOptions::GetOutputFormat(void)

{
  char *pcVar1;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t sVar2;
  char *a_c_str;
  String *in_RDI;
  String SVar3;
  
  a_c_str = FLAGS_gtest_output;
  if (FLAGS_gtest_output == (char *)0x0) {
    a_c_str = "";
  }
  else {
    pcVar1 = strchr(FLAGS_gtest_output,0x3a);
    if (pcVar1 != (char *)0x0) {
      String::ConstructNonNull(in_RDI,a_c_str,(long)pcVar1 - (long)a_c_str);
      sVar2 = extraout_RDX;
      goto LAB_001116a1;
    }
  }
  String::String(in_RDI,a_c_str);
  sVar2 = extraout_RDX_00;
LAB_001116a1:
  SVar3.length_ = sVar2;
  SVar3.c_str_ = (char *)in_RDI;
  return SVar3;
}

Assistant:

String UnitTestOptions::GetOutputFormat() {
  const char* const gtest_output_flag = GTEST_FLAG(output).c_str();
  if (gtest_output_flag == NULL) return String("");

  const char* const colon = strchr(gtest_output_flag, ':');
  return (colon == NULL) ?
      String(gtest_output_flag) :
      String(gtest_output_flag, colon - gtest_output_flag);
}